

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.C
# Opt level: O1

int Filter::fnmatch(char *__pattern,char *__name,int __flags)

{
  uint uVar1;
  undefined8 *puVar2;
  int *piVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  char *local_28;
  
  uVar1 = ::fnmatch(*(char **)__pattern,*(char **)__name,__flags << 4);
  if (uVar1 < 2) {
    return CONCAT31((int3)(uVar1 >> 8),uVar1 == 0);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  piVar3 = __errno_location();
  local_28 = strerror(*piVar3);
  local_38 = *(undefined8 *)__pattern;
  uStack_30 = *(undefined8 *)(__pattern + 8);
  fmt.size_ = 0xcd;
  fmt.data_ = (char *)0x19;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_38;
  ::fmt::v10::vformat_abi_cxx11_(&local_58,(v10 *)"Invalid pattern \"{}\" : {}",fmt,args);
  *puVar2 = &PTR__Error_0013b7d8;
  puVar2[1] = puVar2 + 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    *(undefined4 *)(puVar2 + 3) = local_58.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)puVar2 + 0x1c) = local_58.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)(puVar2 + 4) = local_58.field_2._8_4_;
    *(undefined4 *)((long)puVar2 + 0x24) = local_58.field_2._12_4_;
  }
  else {
    puVar2[1] = local_58._M_dataplus._M_p;
    puVar2[3] = CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                         local_58.field_2._M_allocated_capacity._0_4_);
  }
  puVar2[2] = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity._0_4_ =
       local_58.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  __cxa_throw(puVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

bool Filter::fnmatch(std::string const & pattern, std::string const & string, bool icase)
{
#if defined(_UNIX)
	// POSIX fnmatch
	int const rval = ::fnmatch(pattern.c_str(), string.c_str(), icase ? FNM_CASEFOLD : 0);
	if (rval != 0 && rval != FNM_NOMATCH) {
		THROW_ERROR("Invalid pattern \"{}\" : {}", pattern, strerror(errno));
	}
	return (rval == 0);
#endif
#if defined(_WIN32)
	return PathMatchSpecA(string.c_str(), pattern.c_str());
#endif
}